

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O3

void printOptionValues(TidyDoc tdoc,TidyOption topt,OptionDesc *d)

{
  uint uVar1;
  TidyOptionId optId;
  TidyConfigCategory TVar2;
  TidyIterator in_RAX;
  ctmbstr ptVar3;
  TidyIterator pos;
  TidyIterator local_38;
  
  local_38 = in_RAX;
  optId = tidyOptGetId(topt);
  TVar2 = tidyOptGetCategory(topt);
  if (TVar2 != TidyInternalCategory) {
    uVar1 = optId - TidyBlockTags;
    if (uVar1 < 0x3e) {
      if ((0x1000000400010001U >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
        if (((ulong)uVar1 == 0x3d) &&
           (local_38 = tidyOptGetPriorityAttrList(tdoc),
           (undefined1 *)0x1 < (undefined1 *)((long)&local_38->_opaque + 1))) {
          do {
            ptVar3 = tidyOptGetNextPriorityAttr(tdoc,&local_38);
            d->def = ptVar3;
            if (local_38 == (TidyIterator)0x0) break;
            printf("%-27.27s %-9.9s  %-40.40s\n",d->name,d->type,ptVar3);
            d->name = "";
            d->type = "";
          } while (local_38 != (TidyIterator)0x0);
        }
      }
      else {
        local_38 = tidyOptGetDeclTagList(tdoc);
        while (local_38 != (TidyIterator)0x0) {
          ptVar3 = tidyOptGetNextDeclTag(tdoc,optId,&local_38);
          d->def = ptVar3;
          if (local_38 == (TidyIterator)0x0) break;
          printf("%-27.27s %-9.9s  %-40.40s\n",d->name,d->type,ptVar3);
          d->name = "";
          d->type = "";
        }
      }
    }
    if (((*d->name != '\0') || (*d->type != '\0')) || ((d->def != (char *)0x0 && (*d->def != '\0')))
       ) {
      if (d->def == (ctmbstr)0x0) {
        d->def = "";
      }
      printf("%-27.27s %-9.9s  %-40.40s\n",d->name,d->type);
    }
  }
  return;
}

Assistant:

static void printOptionValues(TidyDoc ARG_UNUSED(tdoc),  /**< The Tidy document. */
                              TidyOption topt,           /**< The option for which to show values. */
                              OptionDesc *d              /**< The OptionDesc array. */
                              )
{
    TidyOptionId optId = tidyOptGetId( topt );

    if ( tidyOptGetCategory(topt) == TidyInternalCategory )
        return;

    switch ( optId )
    {
        case TidyInlineTags:
        case TidyBlockTags:
        case TidyEmptyTags:
        case TidyPreTags:
        {
            TidyIterator pos = tidyOptGetDeclTagList( tdoc );
            while ( pos )
            {
                d->def = tidyOptGetNextDeclTag(tdoc, optId, &pos);
                if ( pos )
                {
                    printf( fmt, d->name, d->type, d->def );
                    d->name = "";
                    d->type = "";
                }
            }
        }
            break;
        case TidyPriorityAttributes: /* Is #697 - This case seems missing */
        {
            TidyIterator itAttr = tidyOptGetPriorityAttrList(tdoc);
            if (itAttr && (itAttr != (TidyIterator)-1))
            {
                while (itAttr)
                {
                    d->def = tidyOptGetNextPriorityAttr(tdoc, &itAttr);
                    if (itAttr)
                    {
                        printf(fmt, d->name, d->type, d->def);
                        d->name = "";
                        d->type = "";
                    }
                }
            }
        }
            break;
        default:
            break;
    }

    /* fix for http://tidy.sf.net/bug/873921 */
    if ( *d->name || *d->type || (d->def && *d->def) )
    {
        if ( ! d->def )
            d->def = "";
        printf( fmt, d->name, d->type, d->def );
    }
}